

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Cast * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::doCast<wasm::BrOn>
          (Cast *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          BrOn *curr)

{
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> *this_00;
  bool bVar1;
  HeapType left;
  HeapType right;
  Literal *pLVar2;
  __index_type _Var3;
  Literal *other;
  Flow local_1e0;
  Breaking local_198 [8];
  Literal local_190;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_178;
  Literal local_150;
  Literal local_138;
  Literal local_120;
  Literal local_108;
  Literal local_f0;
  Literal local_d8;
  Literal local_c0;
  Literal local_a8;
  undefined1 local_90 [8];
  Flow ref;
  Literal val;
  Type castType;
  
  visit((Flow *)local_90,this,curr->ref);
  if (ref.breakTo.super_IString.str._M_len == 0) {
    if (((long)((long)ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 + (long)local_90 != 1) {
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0x43,"const Literal &wasm::Flow::getSingleValue()");
    }
    Literal::Literal((Literal *)&ref.breakTo.super_IString.str._M_str,(Literal *)&ref);
    val.type.id = (curr->castType).id;
    bVar1 = Literal::isNull((Literal *)&ref.breakTo.super_IString.str._M_str);
    if (bVar1) {
      bVar1 = wasm::Type::isNullable(&val.type);
      if (bVar1) {
        Literal::Literal(&local_f0,(Literal *)&ref.breakTo.super_IString.str._M_str);
        pLVar2 = &local_150;
        other = &local_f0;
        Literal::Literal(pLVar2,other);
        _Var3 = '\x01';
        Literal::Literal((Literal *)__return_storage_ptr__,pLVar2);
      }
      else {
        Literal::Literal(&local_d8,(Literal *)&ref.breakTo.super_IString.str._M_str);
        pLVar2 = &local_138;
        other = &local_d8;
        Literal::Literal(pLVar2,other);
        _Var3 = '\x02';
        Literal::Literal((Literal *)__return_storage_ptr__,pLVar2);
      }
    }
    else {
      left = wasm::Type::getHeapType((Type *)&val.field_0.func.super_IString.str._M_str);
      right = wasm::Type::getHeapType(&val.type);
      bVar1 = HeapType::isSubType(left,right);
      if (bVar1) {
        Literal::Literal(&local_c0,(Literal *)&ref.breakTo.super_IString.str._M_str);
        pLVar2 = &local_120;
        other = &local_c0;
        Literal::Literal(pLVar2,other);
        _Var3 = '\x01';
        Literal::Literal((Literal *)__return_storage_ptr__,pLVar2);
      }
      else {
        Literal::Literal(&local_a8,(Literal *)&ref.breakTo.super_IString.str._M_str);
        pLVar2 = &local_108;
        other = &local_a8;
        Literal::Literal(pLVar2,other);
        _Var3 = '\x02';
        Literal::Literal((Literal *)__return_storage_ptr__,pLVar2);
      }
    }
    *(__index_type *)
     ((long)&(__return_storage_ptr__->state).
             super__Variant_base<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
             .
             super__Move_assign_alias<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
             .
             super__Copy_assign_alias<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
             .
             super__Move_ctor_alias<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
             .
             super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
             .
             super__Variant_storage_alias<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
     + 0x48) = _Var3;
    Literal::~Literal(pLVar2);
    Literal::~Literal(other);
    pLVar2 = (Literal *)&ref.breakTo.super_IString.str._M_str;
  }
  else {
    pLVar2 = local_1e0.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems;
    local_1e0.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = (size_t)local_90;
    Literal::Literal(pLVar2,(Literal *)&ref);
    this_00 = &local_1e0.values.super_SmallVector<wasm::Literal,_1UL>.flexible;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
              (this_00,(vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                       &ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    local_1e0.breakTo.super_IString.str._M_len =
         (size_t)ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    local_1e0.breakTo.super_IString.str._M_str = (char *)ref.breakTo.super_IString.str._M_len;
    Cast::Breaking::Breaking(local_198,&local_1e0);
    std::__detail::__variant::
    _Uninitialized<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,false>
    ::_Uninitialized<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking&>
              ((_Uninitialized<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,false>
                *)__return_storage_ptr__,local_198);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->state).
             super__Variant_base<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
             .
             super__Move_assign_alias<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
             .
             super__Copy_assign_alias<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
             .
             super__Move_ctor_alias<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
             .
             super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
             .
             super__Variant_storage_alias<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
     + 0x48) = '\0';
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_178);
    Literal::~Literal(&local_190);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(this_00);
  }
  Literal::~Literal(pLVar2);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&ref);
  return __return_storage_ptr__;
}

Assistant:

Cast doCast(T* curr) {
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return typename Cast::Breaking{ref};
    }
    Literal val = ref.getSingleValue();
    Type castType = curr->getCastType();
    if (val.isNull()) {
      if (castType.isNullable()) {
        return typename Cast::Success{val};
      } else {
        return typename Cast::Failure{val};
      }
    }
    if (HeapType::isSubType(val.type.getHeapType(), castType.getHeapType())) {
      return typename Cast::Success{val};
    } else {
      return typename Cast::Failure{val};
    }
  }